

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_int>::resetPool
          (btAxisSweep3Internal<unsigned_int> *this,btDispatcher *param_1)

{
  Handle *pHVar1;
  undefined4 *puVar2;
  ulong uVar3;
  
  if (this->m_numHandles != 0) {
    return;
  }
  this->m_firstFreeHandle = 1;
  pHVar1 = this->m_pHandles;
  puVar2 = (undefined4 *)&pHVar1[1].super_btBroadphaseProxy.field_0x3c;
  uVar3 = 1;
  while (uVar3 < this->m_maxHandles) {
    uVar3 = uVar3 + 1;
    *puVar2 = (int)uVar3;
    puVar2 = puVar2 + 0x18;
  }
  *(undefined4 *)&pHVar1[this->m_maxHandles - 1].super_btBroadphaseProxy.field_0x3c = 0;
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::resetPool(btDispatcher* /*dispatcher*/)
{
	if (m_numHandles == 0)
	{
		m_firstFreeHandle = 1;
		{
			for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < m_maxHandles; i++)
				m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
			m_pHandles[m_maxHandles - 1].SetNextFree(0);
		}
	}
}